

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void do_group(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  CHAR_DATA *pCVar10;
  CHAR_DATA *pCVar11;
  CClass *pCVar12;
  CHAR_DATA *pCVar13;
  char *pcVar14;
  int iVar15;
  undefined **ppuVar16;
  basic_string_view<char> fmt;
  basic_string_view<char> format;
  basic_string_view<char> format_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args_01;
  string buffer;
  AFFECT_DATA af;
  char arg [4608];
  long *local_2728 [2];
  long local_2718 [2];
  CHAR_DATA *local_2708;
  AFFECT_DATA *local_2700;
  char *local_26f8;
  undefined8 local_26f0;
  char local_26e8;
  undefined7 uStack_26e7;
  _func_int **local_26d8;
  double local_26d0;
  AFFECT_DATA *local_26c8 [2];
  AFFECT_DATA local_26b8;
  buffer<char> local_2650;
  char local_2630 [504];
  AFFECT_DATA local_2438 [44];
  char local_1238 [4616];
  
  one_argument(argument,local_1238);
  if (local_1238[0] == '\0') {
    local_26f8 = &local_26e8;
    local_26f0 = 0;
    local_26e8 = '\0';
    pCVar10 = ch->leader;
    if (ch->leader == (CHAR_DATA *)0x0) {
      pCVar10 = ch;
    }
    local_2728[0] = (long *)pers(pCVar10,ch);
    local_2650.size_ = 0;
    ppuVar16 = &PTR_grow_0044b3a0;
    local_2650._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
    local_2650.capacity_ = 500;
    fmt.size_ = 0xd;
    fmt.data_ = "{}\'s group:\n\r";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_2728;
    args.desc_ = 0xc;
    local_2650.ptr_ = local_2630;
    ::fmt::v9::detail::vformat_to<char>(&local_2650,fmt,args,(locale_ref)0x0);
    local_26c8[0] = &local_26b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_26c8,local_2650.ptr_,local_2650.ptr_ + local_2650.size_);
    if (local_2650.ptr_ != local_2630) {
      operator_delete(local_2650.ptr_,local_2650.capacity_);
    }
    std::__cxx11::string::operator=((string *)&local_26f8,(string *)local_26c8);
    if (local_26c8[0] != &local_26b8) {
      operator_delete(local_26c8[0],(ulong)((long)&(local_26b8.next)->next + 1));
    }
    send_to_char(local_26f8,ch);
    if (char_list != (CHAR_DATA *)0x0) {
      local_26d8 = (_func_int **)&PTR_grow_0044b3a0;
      pCVar10 = char_list;
      local_2708 = ch;
      do {
        pCVar11 = pCVar10->leader;
        if (pCVar10->leader == (CHAR_DATA *)0x0) {
          pCVar11 = pCVar10;
        }
        pCVar13 = ch->leader;
        if (ch->leader == (CHAR_DATA *)0x0) {
          pCVar13 = ch;
        }
        if (pCVar11 == pCVar13) {
          bVar6 = is_npc(pCVar10);
          if (bVar6) {
            pcVar14 = pers(pCVar10,ch);
            strcpy((char *)local_2438,pcVar14);
            cVar5 = (char)local_2438[0].next;
            if (((char)local_2438[0].next != '\0') &&
               (cVar5 = (char)local_2438[0].next + -0x20,
               0x19 < (byte)((char)local_2438[0].next + 0x9fU))) {
              cVar5 = (char)local_2438[0].next;
            }
            local_2438[0].next._0_1_ = cVar5;
            if (pCVar10->max_hit == 0) {
              local_26b8.next = (AFFECT_DATA *)0x0;
            }
            else {
              local_26b8.next =
                   (AFFECT_DATA *)
                   ((long)(pCVar10->hit * 100) / (long)(int)pCVar10->max_hit & 0xffffffff);
            }
            if (pCVar10->max_mana == 0) {
              local_26b8.name = (char *)0x0;
            }
            else {
              local_26b8.name =
                   (char *)((long)(pCVar10->mana * 100) / (long)(int)pCVar10->max_mana & 0xffffffff)
              ;
            }
            if (pCVar10->max_move == 0) {
              local_26b8._32_8_ = 0;
            }
            else {
              local_26b8._32_8_ =
                   (long)(pCVar10->move * 100) / (long)(int)pCVar10->max_move & 0xffffffff;
            }
            local_2650.size_ = 0;
            local_2650.capacity_ = 500;
            format.size_ = 0x2a;
            format.data_ = "[Minion] %-32s %3d%%hp %3d%%mana %3d%%mv\n\r";
            args_00.field_1.values_ =
                 (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_26c8;
            args_00.desc_ = 0x111c;
            local_26c8[0] = local_2438;
            local_2650._vptr_buffer = (_func_int **)ppuVar16;
            local_2650.ptr_ = local_2630;
            ::fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                      (&local_2650,format,args_00);
            local_2728[0] = local_2718;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2728,local_2650.ptr_,local_2650.ptr_ + local_2650.size_);
            if (local_2650.ptr_ != local_2630) {
LAB_0023ec37:
              operator_delete(local_2650.ptr_,local_2650.capacity_);
            }
          }
          else {
            sVar1 = pCVar10->level;
            iVar7 = exp_per_level(pCVar10);
            iVar15 = pCVar10->exp;
            sVar2 = pc_race_table[pCVar10->race].xpadd;
            sVar3 = pCVar10->level;
            iVar8 = exp_per_level(pCVar10);
            local_26d0 = (double)((sVar3 + -2) * (sVar2 + 0x5dc)) * 0.08;
            sVar4 = pCVar10->level;
            bVar6 = is_npc(pCVar10);
            local_2700 = (AFFECT_DATA *)0x37cc6e;
            if (!bVar6) {
              pCVar12 = pCVar10->my_class;
              if ((pCVar12 == (CClass *)0x0) &&
                 ((pCVar10->pIndexData == (MOB_INDEX_DATA *)0x0 ||
                  (pCVar12 = pCVar10->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
                pCVar12 = CClass::GetClass(0);
              }
              local_2700 = (AFFECT_DATA *)RString::operator_cast_to_char_(&pCVar12->who_name);
            }
            pcVar14 = pers(pCVar10,local_2708);
            local_26b8.name = capitalize(pcVar14);
            ppuVar16 = local_26d8;
            if (pCVar10->max_hit == 0) {
              local_26b8._32_8_ = 0;
            }
            else {
              local_26b8._32_8_ =
                   (long)(pCVar10->hit * 100) / (long)(int)pCVar10->max_hit & 0xffffffff;
            }
            if (pCVar10->max_mana == 0) {
              local_26b8.bitvector[1] = 0;
            }
            else {
              local_26b8.bitvector[1] =
                   (long)(pCVar10->mana * 100) / (long)(int)pCVar10->max_mana & 0xffffffff;
            }
            if (pCVar10->max_move == 0) {
              local_26b8.tick_fun = (AFF_FUN *)0x0;
            }
            else {
              local_26b8.tick_fun =
                   (AFF_FUN *)
                   ((long)(pCVar10->move * 100) / (long)(int)pCVar10->max_move & 0xffffffff);
            }
            uVar9 = ((iVar7 * sVar1 - iVar15) * 100) /
                    (iVar8 * sVar3 - (sVar4 + -1) * ((int)local_26d0 + (int)sVar2 + 0x5dc));
            local_26c8[0] = (AFFECT_DATA *)(ulong)(uint)(int)pCVar10->level;
            local_26b8.next = local_2700;
            if (99 < (int)uVar9) {
              uVar9 = 100;
            }
            local_26b8.end_fun = (AFF_FUN *)(ulong)uVar9;
            if ((int)uVar9 < 1) {
              local_26b8.end_fun = (AFF_FUN *)0x0;
            }
            local_2650.size_ = 0;
            local_2650._vptr_buffer = local_26d8;
            local_2650.capacity_ = 500;
            format_00.size_ = 0x33;
            format_00.data_ = "[%2d %s] %-32s %3d%%hp %3d%%mana %3d%%mv %3d%%tnl\n\r";
            args_01.field_1.values_ =
                 (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_26c8;
            args_01.desc_ = 0x1111cc1;
            local_2650.ptr_ = local_2630;
            ::fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                      (&local_2650,format_00,args_01);
            local_2728[0] = local_2718;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2728,local_2650.ptr_,local_2650.ptr_ + local_2650.size_);
            ch = local_2708;
            if (local_2650.ptr_ != local_2630) goto LAB_0023ec37;
          }
          std::__cxx11::string::operator=((string *)&local_26f8,(string *)local_2728);
          if (local_2728[0] != local_2718) {
            operator_delete(local_2728[0],local_2718[0] + 1);
          }
          send_to_char(local_26f8,ch);
        }
        pCVar10 = pCVar10->next;
      } while (pCVar10 != (CHAR_DATA *)0x0);
    }
    if (local_26f8 == &local_26e8) {
      return;
    }
    operator_delete(local_26f8,CONCAT71(uStack_26e7,local_26e8) + 1);
    return;
  }
  pCVar10 = get_char_room(ch,local_1238);
  if (pCVar10 == (CHAR_DATA *)0x0) {
    pcVar14 = "They aren\'t here.\n\r";
  }
  else {
    if ((ch->master == (CHAR_DATA *)0x0) && (ch->leader == ch || ch->leader == (CHAR_DATA *)0x0)) {
      if ((pCVar10 == ch) || (pCVar10->master == ch)) {
        bVar6 = is_affected_by(pCVar10,0x12);
        if (bVar6) {
          pcVar14 = "You can\'t remove charmed followers from your group.\n\r";
          goto LAB_0023ee10;
        }
        bVar6 = is_affected_by(ch,0x12);
        if (!bVar6) {
          pCVar11 = pCVar10->leader;
          if (pCVar10->leader == (CHAR_DATA *)0x0) {
            pCVar11 = pCVar10;
          }
          pCVar13 = ch->leader;
          if (ch->leader == (CHAR_DATA *)0x0) {
            pCVar13 = ch;
          }
          if ((pCVar10 != ch) && (pCVar11 == pCVar13)) {
            pCVar10->leader = (CHAR_DATA *)0x0;
            act_new("$n removes $N from $s group.",ch,(void *)0x0,pCVar10,1,5);
            act_new("$n removes you from $s group.",ch,(void *)0x0,pCVar10,2,4);
            act_new("You remove $N from your group.",ch,(void *)0x0,pCVar10,3,4);
            check_leadership_affect(pCVar10);
            return;
          }
          pCVar10->leader = ch;
          act_new("$N joins $n\'s group.",ch,(void *)0x0,pCVar10,1,5);
          act_new("You join $n\'s group.",ch,(void *)0x0,pCVar10,2,4);
          act_new("$N joins your group.",ch,(void *)0x0,pCVar10,3,4);
          bVar6 = is_npc(ch);
          if ((!bVar6) && (bVar6 = is_npc(pCVar10), !bVar6)) {
            pCVar12 = char_data::Class(ch);
            bVar6 = RString::operator==(&pCVar12->name,"anti-paladin");
            if ((bVar6) && (1 < ch->pcdata->learned[gsn_traitors_luck])) {
              init_affect(local_2438);
              local_2438[0].where = 0;
              local_2438[0].aftype = 5;
              local_2438[0].type = gsn_traitors_luck;
              local_2438[0].level = ch->level;
              local_2438[0].duration = -1;
              local_2438[0].bitvector[0]._3_1_ = local_2438[0].bitvector[0]._3_1_ | 1;
              local_2438[0].location = 0;
              local_2438[0].modifier = 0;
              local_2438[0].pulse_fun = traitor_pulse;
              local_2438[0].owner = ch;
              new_affect_to_char(ch,local_2438);
            }
          }
          bVar6 = is_npc(ch);
          if (bVar6) {
            return;
          }
          bVar6 = is_npc(pCVar10);
          if (bVar6) {
            return;
          }
          pCVar12 = char_data::Class(pCVar10);
          bVar6 = RString::operator==(&pCVar12->name,"anti-paladin");
          if (!bVar6) {
            return;
          }
          if (pCVar10->pcdata->learned[gsn_traitors_luck] < 2) {
            return;
          }
          init_affect(local_2438);
          local_2438[0].where = 0;
          local_2438[0].aftype = 5;
          local_2438[0].type = gsn_traitors_luck;
          local_2438[0].level = ch->level;
          local_2438[0].duration = -1;
          local_2438[0].bitvector[0]._3_1_ = local_2438[0].bitvector[0]._3_1_ | 1;
          local_2438[0].location = 0;
          local_2438[0].modifier = 0;
          local_2438[0].pulse_fun = traitor_pulse;
          if (char_list == (CHAR_DATA *)0x0) {
            return;
          }
          pCVar11 = char_list;
          local_2438[0].owner = pCVar10;
          do {
            if (pCVar11 != ch) {
              pCVar10 = pCVar11->leader;
              if (pCVar11->leader == (CHAR_DATA *)0x0) {
                pCVar10 = pCVar11;
              }
              pCVar13 = ch->leader;
              if (ch->leader == (CHAR_DATA *)0x0) {
                pCVar13 = ch;
              }
              if (pCVar10 == pCVar13) {
                new_affect_to_char(pCVar11,local_2438);
              }
            }
            pCVar11 = pCVar11->next;
          } while (pCVar11 != (CHAR_DATA *)0x0);
          return;
        }
        pcVar14 = "You like your master too much to leave $m!";
        iVar15 = 2;
      }
      else {
        pcVar14 = "$N isn\'t following you.";
        iVar15 = 3;
      }
      act_new(pcVar14,ch,(void *)0x0,pCVar10,iVar15,4);
      return;
    }
    pcVar14 = "But you are following someone else!\n\r";
  }
LAB_0023ee10:
  send_to_char(pcVar14,ch);
  return;
}

Assistant:

void do_group(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		std::string buffer;
		char buf2[MAX_STRING_LENGTH];
		auto leader = ch->leader != nullptr ? ch->leader : ch;

		buffer = fmt::format("{}'s group:\n\r", pers(leader, ch));
		send_to_char(buffer.c_str(), ch);

		for (auto gch = char_list; gch != nullptr; gch = gch->next)
		{
			if (is_same_group(gch, ch))
			{
				if (!is_npc(gch))
				{
					auto exp_tnl = (gch->level * exp_per_level(gch) - gch->exp);
					auto epl = pc_race_table[gch->race].xpadd + 1500;
					epl += (int)((gch->level - 2) * epl * 0.08);
					auto exp_ltl = (gch->level * exp_per_level(gch) - (gch->level - 1) * epl);
					buffer = fmt::sprintf("[%2d %s] %-32s %3d%%hp %3d%%mana %3d%%mv %3d%%tnl\n\r",
							gch->level,
							is_npc(gch) ? "Mob" : gch->Class()->who_name,
							capitalize(pers(gch, ch)),
							(gch->max_hit == 0) ? 0 : (gch->hit * 100) / gch->max_hit,
							(gch->max_mana == 0) ? 0 : (gch->mana * 100) / gch->max_mana,
							(gch->max_move == 0) ? 0 : (gch->move * 100) / gch->max_move,
							URANGE(0, (exp_tnl * 100) / exp_ltl, 100));
				}
				else
				{
					sprintf(buf2, "%s", pers(gch, ch));
					if (buf2[0] != '\0')
						buf2[0] = UPPER(buf2[0]);

					buffer = fmt::sprintf("[Minion] %-32s %3d%%hp %3d%%mana %3d%%mv\n\r",
							buf2,
							(gch->max_hit == 0) ? 0 : (gch->hit * 100) / gch->max_hit,
							(gch->max_mana == 0) ? 0 : (gch->mana * 100) / gch->max_mana,
							(gch->max_move == 0) ? 0 : (gch->move * 100) / gch->max_move);
				}

				send_to_char(buffer.c_str(), ch);
			}
		}

		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->master != nullptr || (ch->leader != nullptr && ch->leader != ch))
	{
		send_to_char("But you are following someone else!\n\r", ch);
		return;
	}

	if (victim->master != ch && ch != victim)
	{
		act_new("$N isn't following you.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);
		return;
	}

	if (is_affected_by(victim, AFF_CHARM))
	{
		send_to_char("You can't remove charmed followers from your group.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_CHARM))
	{
		act_new("You like your master too much to leave $m!", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
		return;
	}

	if (is_same_group(victim, ch) && ch != victim)
	{
		victim->leader = nullptr;
		act_new("$n removes $N from $s group.", ch, nullptr, victim, TO_NOTVICT, POS_RESTING);
		act_new("$n removes you from $s group.", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
		act_new("You remove $N from your group.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);
		check_leadership_affect(victim);
		return;
	}

	victim->leader = ch;
	act_new("$N joins $n's group.", ch, nullptr, victim, TO_NOTVICT, POS_RESTING);
	act_new("You join $n's group.", ch, nullptr, victim, TO_VICT, POS_SLEEPING);
	act_new("$N joins your group.", ch, nullptr, victim, TO_CHAR, POS_SLEEPING);

	AFFECT_DATA af;
	if (!is_npc(ch) && !is_npc(victim) && ch->Class()->name == "anti-paladin" && ch->pcdata->learned[gsn_traitors_luck] > 1)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_traitors_luck;
		af.owner = ch;
		af.level = ch->level;
		af.duration = -1;
		SET_BIT(af.bitvector, AFF_PERMANENT);
		af.modifier = 0;
		af.location = 0;
		af.pulse_fun = traitor_pulse;
		new_affect_to_char(ch, &af);
	}

	if (!is_npc(ch) && !is_npc(victim) && victim->Class()->name == "anti-paladin" && victim->pcdata->learned[gsn_traitors_luck] > 1)
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_traitors_luck;
		af.owner = victim;
		af.level = ch->level;
		af.duration = -1;
		SET_BIT(af.bitvector, AFF_PERMANENT);
		af.modifier = 0;
		af.location = 0;
		af.pulse_fun = traitor_pulse;

		for (auto vch = char_list; vch; vch = vch->next)
		{
			if (vch != ch && is_same_group(vch, ch))
				new_affect_to_char(vch, &af);
		}
	}
}